

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O2

void highbd_hev_filter_mask_x_sse2
               (__m128i *pq,int x,__m128i *p1p0,__m128i *q1q0,__m128i *abs_p1p0,__m128i *l,
               __m128i *bl,__m128i *t,__m128i *hev,__m128i *mask)

{
  longlong lVar1;
  long lVar2;
  __m128i *palVar3;
  ushort uVar4;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar12;
  ushort uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined4 uVar17;
  short sVar22;
  short sVar23;
  __m128i alVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  __m128i alVar24;
  undefined1 auVar25 [16];
  short sVar5;
  short sVar11;
  short sVar13;
  undefined8 uVar18;
  
  lVar1 = pq[1][0];
  (*p1p0)[0] = (*pq)[0];
  (*p1p0)[1] = lVar1;
  alVar19[1] = pq[1][1];
  alVar19[0] = (*pq)[1];
  *q1q0 = alVar19;
  auVar16 = _DAT_00433880;
  auVar15 = psubusw((undefined1  [16])*p1p0,(undefined1  [16])alVar19);
  auVar20 = psubusw((undefined1  [16])alVar19,(undefined1  [16])*p1p0);
  auVar20 = auVar20 | auVar15;
  auVar15 = paddusw(auVar20,auVar20);
  auVar15._8_8_ = 0;
  auVar25._0_2_ = auVar20._8_2_ >> 1;
  auVar25._2_2_ = auVar20._10_2_ >> 1;
  auVar25._4_2_ = auVar20._12_2_ >> 1;
  auVar25._6_2_ = auVar20._14_2_ >> 1;
  auVar25._8_8_ = 0;
  auVar20 = paddusw(auVar25,auVar15);
  auVar20 = auVar20 ^ _DAT_00433880;
  auVar15 = (undefined1  [16])*bl ^ _DAT_00433880;
  auVar21._0_2_ = -(ushort)(auVar15._0_2_ < auVar20._0_2_);
  auVar21._2_2_ = -(ushort)(auVar15._2_2_ < auVar20._2_2_);
  auVar21._4_2_ = -(ushort)(auVar15._4_2_ < auVar20._4_2_);
  auVar21._6_2_ = -(ushort)(auVar15._6_2_ < auVar20._6_2_);
  auVar21._8_2_ = -(ushort)(auVar15._8_2_ < auVar20._8_2_);
  auVar21._10_2_ = -(ushort)(auVar15._10_2_ < auVar20._10_2_);
  auVar21._12_2_ = -(ushort)(auVar15._12_2_ < auVar20._12_2_);
  auVar21._14_2_ = -(ushort)(auVar15._14_2_ < auVar20._14_2_);
  auVar15 = paddusw((undefined1  [16])*l,_DAT_0046d7b0);
  auVar15 = auVar15 & auVar21;
  auVar25 = psubusw((undefined1  [16])*pq,(undefined1  [16])pq[1]);
  auVar20 = psubusw((undefined1  [16])pq[1],(undefined1  [16])*pq);
  alVar24 = (__m128i)(auVar20 | auVar25);
  *abs_p1p0 = alVar24;
  sVar13 = (short)alVar24[0];
  sVar11 = (short)alVar24[1];
  auVar20._0_2_ = (ushort)(sVar11 < sVar13) * sVar13 | (ushort)(sVar11 >= sVar13) * sVar11;
  sVar22 = alVar24[0]._2_2_;
  sVar13 = alVar24[1]._2_2_;
  auVar20._2_2_ = (ushort)(sVar13 < sVar22) * sVar22 | (ushort)(sVar13 >= sVar22) * sVar13;
  sVar23 = alVar24[0]._4_2_;
  sVar22 = alVar24[1]._4_2_;
  auVar20._4_2_ = (ushort)(sVar22 < sVar23) * sVar23 | (ushort)(sVar22 >= sVar23) * sVar22;
  sVar5 = alVar24[0]._6_2_;
  sVar23 = alVar24[1]._6_2_;
  auVar20._6_2_ = (ushort)(sVar23 < sVar5) * sVar5 | (ushort)(sVar23 >= sVar5) * sVar23;
  sVar11 = (ushort)(0 < sVar11) * sVar11;
  auVar20._8_2_ = sVar11;
  sVar13 = (ushort)(0 < sVar13) * sVar13;
  auVar20._10_2_ = sVar13;
  sVar22 = (ushort)(0 < sVar22) * sVar22;
  auVar20._12_2_ = sVar22;
  sVar23 = (ushort)(0 < sVar23) * sVar23;
  auVar20._14_2_ = sVar23;
  sVar5 = auVar15._0_2_;
  uVar4 = (sVar5 < (short)auVar20._0_2_) * auVar20._0_2_ |
          (ushort)(sVar5 >= (short)auVar20._0_2_) * sVar5;
  sVar5 = auVar15._2_2_;
  uVar6 = (sVar5 < (short)auVar20._2_2_) * auVar20._2_2_ |
          (ushort)(sVar5 >= (short)auVar20._2_2_) * sVar5;
  sVar5 = auVar15._4_2_;
  uVar7 = (sVar5 < (short)auVar20._4_2_) * auVar20._4_2_ |
          (ushort)(sVar5 >= (short)auVar20._4_2_) * sVar5;
  sVar5 = auVar15._6_2_;
  uVar8 = (sVar5 < (short)auVar20._6_2_) * auVar20._6_2_ |
          (ushort)(sVar5 >= (short)auVar20._6_2_) * sVar5;
  sVar5 = auVar15._8_2_;
  uVar9 = (ushort)(sVar5 < sVar11) * sVar11 | (ushort)(sVar5 >= sVar11) * sVar5;
  sVar11 = auVar15._10_2_;
  uVar10 = (ushort)(sVar11 < sVar13) * sVar13 | (ushort)(sVar11 >= sVar13) * sVar11;
  sVar13 = auVar15._12_2_;
  sVar11 = auVar15._14_2_;
  uVar12 = (ushort)(sVar13 < sVar22) * sVar22 | (ushort)(sVar13 >= sVar22) * sVar13;
  uVar14 = (ushort)(sVar11 < sVar23) * sVar23 | (ushort)(sVar11 >= sVar23) * sVar11;
  auVar20 = auVar20 ^ auVar16;
  auVar16 = auVar16 ^ (undefined1  [16])*t;
  uVar17 = CONCAT22(-(ushort)(auVar16._2_2_ < auVar20._2_2_),
                    -(ushort)(auVar16._0_2_ < auVar20._0_2_));
  uVar18 = CONCAT26(-(ushort)(auVar16._6_2_ < auVar20._6_2_),
                    CONCAT24(-(ushort)(auVar16._4_2_ < auVar20._4_2_),uVar17));
  alVar24[1]._0_4_ = uVar17;
  alVar24[0] = uVar18;
  alVar24[1]._4_4_ = (int)((ulong)uVar18 >> 0x20);
  *hev = alVar24;
  palVar3 = pq + 2;
  for (lVar2 = 2; lVar2 < x; lVar2 = lVar2 + 1) {
    auVar15 = psubusw((undefined1  [16])*palVar3,(undefined1  [16])palVar3[-1]);
    auVar16 = psubusw((undefined1  [16])palVar3[-1],(undefined1  [16])*palVar3);
    auVar16 = auVar16 | auVar15;
    sVar13 = auVar16._0_2_;
    uVar4 = (ushort)((short)uVar4 < sVar13) * sVar13 | ((short)uVar4 >= sVar13) * uVar4;
    sVar13 = auVar16._2_2_;
    uVar6 = (ushort)((short)uVar6 < sVar13) * sVar13 | ((short)uVar6 >= sVar13) * uVar6;
    sVar13 = auVar16._4_2_;
    uVar7 = (ushort)((short)uVar7 < sVar13) * sVar13 | ((short)uVar7 >= sVar13) * uVar7;
    sVar13 = auVar16._6_2_;
    uVar8 = (ushort)((short)uVar8 < sVar13) * sVar13 | ((short)uVar8 >= sVar13) * uVar8;
    sVar13 = auVar16._8_2_;
    uVar9 = (ushort)((short)uVar9 < sVar13) * sVar13 | ((short)uVar9 >= sVar13) * uVar9;
    sVar13 = auVar16._10_2_;
    uVar10 = (ushort)((short)uVar10 < sVar13) * sVar13 | ((short)uVar10 >= sVar13) * uVar10;
    sVar13 = auVar16._12_2_;
    uVar12 = (ushort)((short)uVar12 < sVar13) * sVar13 | ((short)uVar12 >= sVar13) * uVar12;
    sVar13 = auVar16._14_2_;
    uVar14 = (ushort)((short)uVar14 < sVar13) * sVar13 | ((short)uVar14 >= sVar13) * uVar14;
    palVar3 = palVar3 + 1;
  }
  auVar16._0_2_ = ((short)uVar9 < (short)uVar4) * uVar4 | ((short)uVar9 >= (short)uVar4) * uVar9;
  auVar16._2_2_ = ((short)uVar10 < (short)uVar6) * uVar6 | ((short)uVar10 >= (short)uVar6) * uVar10;
  auVar16._4_2_ = ((short)uVar12 < (short)uVar7) * uVar7 | ((short)uVar12 >= (short)uVar7) * uVar12;
  auVar16._6_2_ = ((short)uVar14 < (short)uVar8) * uVar8 | ((short)uVar14 >= (short)uVar8) * uVar14;
  auVar16._8_2_ = (0 < (short)uVar9) * uVar9;
  auVar16._10_2_ = (0 < (short)uVar10) * uVar10;
  auVar16._12_2_ = (0 < (short)uVar12) * uVar12;
  auVar16._14_2_ = (0 < (short)uVar14) * uVar14;
  auVar16 = psubusw(auVar16,(undefined1  [16])*l);
  *(ushort *)*mask = -(ushort)(auVar16._0_2_ == 0);
  *(ushort *)((long)*mask + 2) = -(ushort)(auVar16._2_2_ == 0);
  *(ushort *)((long)*mask + 4) = -(ushort)(auVar16._4_2_ == 0);
  *(ushort *)((long)*mask + 6) = -(ushort)(auVar16._6_2_ == 0);
  *(ushort *)(*mask + 1) = -(ushort)(auVar16._8_2_ == 0);
  *(ushort *)((long)*mask + 10) = -(ushort)(auVar16._10_2_ == 0);
  *(ushort *)((long)*mask + 0xc) = -(ushort)(auVar16._12_2_ == 0);
  *(ushort *)((long)*mask + 0xe) = -(ushort)(auVar16._14_2_ == 0);
  return;
}

Assistant:

static inline void highbd_hev_filter_mask_x_sse2(__m128i *pq, int x,
                                                 __m128i *p1p0, __m128i *q1q0,
                                                 __m128i *abs_p1p0, __m128i *l,
                                                 __m128i *bl, __m128i *t,
                                                 __m128i *hev, __m128i *mask) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m128i ffff = _mm_set1_epi16((short)0xFFFF);
  __m128i abs_p0q0_p1q1, abs_p0q0, abs_p1q1, abs_q1q0;
  __m128i max, max01, h;

  *p1p0 = _mm_unpacklo_epi64(pq[0], pq[1]);
  *q1q0 = _mm_unpackhi_epi64(pq[0], pq[1]);

  abs_p0q0_p1q1 = abs_diff16(*p1p0, *q1q0);
  abs_p0q0 = _mm_adds_epu16(abs_p0q0_p1q1, abs_p0q0_p1q1);
  abs_p0q0 = _mm_unpacklo_epi64(abs_p0q0, zero);

  abs_p1q1 = _mm_srli_si128(abs_p0q0_p1q1, 8);
  abs_p1q1 = _mm_srli_epi16(abs_p1q1, 1);  // divide by 2

  max = _mm_subs_epu16(_mm_adds_epu16(abs_p0q0, abs_p1q1), *bl);
  max = _mm_xor_si128(_mm_cmpeq_epi16(max, zero), ffff);
  // mask |= (abs(*p0 - *q0) * 2 + abs(*p1 - *q1) / 2  > blimit) * -1;
  // So taking maximums continues to work:
  max = _mm_and_si128(max, _mm_adds_epu16(*l, one));

  *abs_p1p0 = abs_diff16(pq[0], pq[1]);
  abs_q1q0 = _mm_srli_si128(*abs_p1p0, 8);
  max01 = _mm_max_epi16(*abs_p1p0, abs_q1q0);
  // mask |= (abs(*p1 - *p0) > limit) * -1;
  // mask |= (abs(*q1 - *q0) > limit) * -1;
  h = _mm_subs_epu16(max01, *t);

  *hev = _mm_xor_si128(_mm_cmpeq_epi16(h, zero), ffff);
  // replicate for the further "merged variables" usage
  *hev = _mm_unpacklo_epi64(*hev, *hev);

  max = _mm_max_epi16(max, max01);
  int i;
  for (i = 2; i < x; ++i) {
    max = _mm_max_epi16(max, abs_diff16(pq[i], pq[i - 1]));
  }
  max = _mm_max_epi16(max, _mm_srli_si128(max, 8));

  max = _mm_subs_epu16(max, *l);
  *mask = _mm_cmpeq_epi16(max, zero);  //  ~mask
}